

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O1

void __thiscall Container::close_all_fds(Container *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  DIR *__dirp;
  ContextManager *pCVar4;
  dirent *pdVar5;
  ulong uVar6;
  Logger *this_00;
  uint __fd;
  char *end;
  string local_60;
  Container *local_40;
  char *local_38;
  
  __dirp = opendir("/proc/self/fd");
  if (__dirp == (DIR *)0x0) {
    pCVar4 = ContextManager::get();
    format_abi_cxx11_(&local_60,"Cannot open /proc/self/fd: %m");
    (**pCVar4->_vptr_ContextManager)(pCVar4,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  uVar1 = dirfd(__dirp);
  if ((int)uVar1 < 0) {
    pCVar4 = ContextManager::get();
    format_abi_cxx11_(&local_60,"Cannot get fd from DIR*: %m");
    (**pCVar4->_vptr_ContextManager)(pCVar4,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  pdVar5 = readdir(__dirp);
  if (pdVar5 != (dirent *)0x0) {
    do {
      uVar6 = strtol(pdVar5->d_name,&local_38,10);
      if ((*local_38 == '\0') && (__fd = (uint)uVar6, uVar1 != __fd && 2 < __fd)) {
        this_00 = Logger::get();
        uVar2 = Logger::get_fd(this_00);
        if ((uVar2 != __fd) &&
           (((uVar2 = CgroupController::get_enter_fd(this->memory_controller_), uVar2 != __fd &&
             (uVar2 = CgroupController::get_enter_fd(this->cpuacct_controller_), uVar2 != __fd)) &&
            (iVar3 = close(__fd), iVar3 != 0)))) {
          local_40 = this;
          pCVar4 = ContextManager::get();
          format_abi_cxx11_(&local_60,"Cannot close fd %d: %m",uVar6 & 0xffffffff);
          (**pCVar4->_vptr_ContextManager)(pCVar4,&local_60);
          this = local_40;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
            this = local_40;
          }
        }
      }
      pdVar5 = readdir(__dirp);
    } while (pdVar5 != (dirent *)0x0);
  }
  iVar3 = closedir(__dirp);
  if (iVar3 != 0) {
    pCVar4 = ContextManager::get();
    format_abi_cxx11_(&local_60,"Cannot close /proc/: %m");
    (**pCVar4->_vptr_ContextManager)(pCVar4,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void Container::close_all_fds() {
    DIR *dir = opendir("/proc/self/fd");
    if (dir == nullptr) {
        die(format("Cannot open /proc/self/fd: %m"));
    }
    fd_t dir_fd = dirfd(dir);
    if (dir_fd < 0) {
        die(format("Cannot get fd from DIR*: %m"));
    }

    struct dirent *dentry;
    while ((dentry = readdir(dir))) {
        char *end;
        fd_t fd = strtol(dentry->d_name, &end, 10);
        if (*end) continue;

        if (fd == STDIN_FILENO || fd == STDOUT_FILENO || fd == STDERR_FILENO || fd == dir_fd
            || fd == Logger::get().get_fd() || fd == memory_controller_->get_enter_fd()
            || fd == cpuacct_controller_->get_enter_fd())
            continue;
        if (close(fd) != 0) {
            die(format("Cannot close fd %d: %m", fd));
        }
    }

    if (closedir(dir) != 0) {
        die(format("Cannot close /proc/: %m"));
    }
}